

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

KeyNode * __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::InsertOrReplaceNode
          (KeyMapBase<unsigned_int> *this,KeyNode *node)

{
  bool bVar1;
  uint uVar2;
  NodeBase *node_00;
  NodeAndBucket NVar3;
  map_index_t local_34;
  map_index_t b;
  NodeAndBucket p;
  KeyNode *to_erase;
  KeyNode *node_local;
  KeyMapBase<unsigned_int> *this_local;
  
  p.bucket = 0;
  p._12_4_ = 0;
  uVar2 = KeyNode<unsigned_int>::key(node);
  NVar3 = FindHelper(this,uVar2,(TreeIterator *)0x0);
  node_00 = NVar3.node;
  local_34 = NVar3.bucket;
  if (node_00 == (NodeBase *)0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar1) {
      uVar2 = KeyNode<unsigned_int>::key(node);
      local_34 = BucketNumber(this,uVar2);
    }
  }
  else {
    erase_no_destroy(this,local_34,(KeyNode *)node_00);
    p._8_8_ = node_00;
  }
  InsertUnique(this,local_34,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return (KeyNode *)p._8_8_;
}

Assistant:

KeyNode* InsertOrReplaceNode(KeyNode* node) {
    KeyNode* to_erase = nullptr;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (p.node != nullptr) {
      erase_no_destroy(p.bucket, static_cast<KeyNode*>(p.node));
      to_erase = static_cast<KeyNode*>(p.node);
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return to_erase;
  }